

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O3

void Sim_UtilSimulate(Sim_Man_t *p,int fType)

{
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pAVar1;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  
  pAVar1 = p->pNtk;
  pVVar2 = pAVar1->vObjs;
  if (0 < pVVar2->nSize) {
    lVar3 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar2->pArray[lVar3];
      if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
        Sim_UtilSimulateNode(p,pNode,fType,fType,fType);
        pAVar1 = p->pNtk;
      }
      lVar3 = lVar3 + 1;
      pVVar2 = pAVar1->vObjs;
    } while (lVar3 < pVVar2->nSize);
  }
  pVVar2 = pAVar1->vCos;
  if (0 < pVVar2->nSize) {
    lVar3 = 0;
    do {
      Sim_UtilSimulateNode(p,(Abc_Obj_t *)pVVar2->pArray[lVar3],fType,fType,fType);
      lVar3 = lVar3 + 1;
      pVVar2 = p->pNtk->vCos;
    } while (lVar3 < pVVar2->nSize);
  }
  return;
}

Assistant:

void Sim_UtilSimulate( Sim_Man_t * p, int fType )
{
    Abc_Obj_t * pNode;
    int i;
    // simulate the internal nodes
    Abc_NtkForEachNode( p->pNtk, pNode, i )
        Sim_UtilSimulateNode( p, pNode, fType, fType, fType );
    // assign simulation info of the CO nodes
    Abc_NtkForEachCo( p->pNtk, pNode, i )
        Sim_UtilSimulateNode( p, pNode, fType, fType, fType );
}